

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadlist.cpp
# Opt level: O3

int __thiscall Quadlist::clear(Quadlist *this)

{
  int iVar1;
  Quadlist QStack_48;
  uint64_t local_30;
  
  iVar1 = this->_size;
  if (0 < iVar1) {
    do {
      remove(&QStack_48,(char *)this);
      if (QStack_48.header != (Quadlistnode *)&stack0xffffffffffffffd0) {
        operator_delete(QStack_48.header,local_30 + 1);
      }
    } while (0 < this->_size);
  }
  return iVar1;
}

Assistant:

int Quadlist::clear() {
    int old_size =_size;
    while (0<_size) remove(header->succ);
    return old_size;
}